

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
SetProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  code *pcVar1;
  PropertyId propertyId_00;
  DynamicObject *instance_00;
  bool bVar2;
  BOOL BVar3;
  uint32 index;
  undefined4 *puVar4;
  ScriptContext *pSVar5;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)info;
  info_local._4_4_ = flags;
  pvStack_30 = value;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4f9,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
  local_50 = ScriptContext::GetPropertyName(pSVar5,value_local._4_4_);
  propertyId_00 = value_local._4_4_;
  pSVar5 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId_00,pSVar5);
  bVar2 = TMapKey_IsJavascriptString<Js::JavascriptString*>();
  if ((!bVar2) || (bVar2 = PropertyRecord::IsSymbol(local_50), !bVar2)) {
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    bVar2 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)this_00,&local_50,
                       (SimpleDictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
    if (bVar2) {
      BVar3 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
              SetPropertyFromDescriptor<false,int>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                          *)this,pDStack_20,value_local._4_4_,value_local._4_4_,
                         (SimpleDictionaryPropertyDescriptor<unsigned_short> *)propertyRecord,
                         pvStack_30,info_local._4_4_,(PropertyValueInfo *)descriptor);
      return BVar3;
    }
  }
  bVar2 = PropertyRecord::IsNumeric(local_50);
  instance_00 = pDStack_20;
  if (bVar2) {
    index = PropertyRecord::GetNumericValue(local_50);
    this_local._4_4_ = SetItem(this,instance_00,index,pvStack_30,info_local._4_4_);
  }
  else {
    this_local._4_4_ =
         SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
         AddProperty<Js::PropertyRecord_const*>
                   ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)
                    this,pDStack_20,local_50,pvStack_30,'\a',(PropertyValueInfo *)descriptor,
                    info_local._4_4_,SideEffects_Any);
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        // It can be the case that propertyRecord is a symbol property and it has the same string description as
        // another property which is in the propertyMap. If we are in a string-keyed type handler, the propertyMap
        // will find that normal property when we call TryGetReference with the symbol propertyRecord. However,
        // we don't want to update that descriptor with value since the two properties are actually different.
        // In fact, we can't store a symbol in a string-keyed type handler at all since the string description
        // is not used for symbols. Instead, we want to skip searching for the descriptor if we are in a string-keyed
        // type handler. When we call AddProperty with the symbol propertyRecord, it should convert us to a
        // const PropertyRecord* - keyed type handler anyway.
        if (!(TMapKey_IsJavascriptString<TMapKey>() && propertyRecord->IsSymbol())
            && propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return SetPropertyFromDescriptor<allowLetConstGlobal>(instance, propertyId, propertyId, descriptor, value, flags, info);
        }

        // Always check numeric propertyId. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return this->SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }

        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }